

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O1

bool __thiscall testing::Test::Check(Test *this,bool condition,char *file,int line,char *error)

{
  undefined7 in_register_00000031;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,condition) == 0) {
    (anonymous_namespace)::StringPrintf_abi_cxx11_(&local_38,"*** Failure in %s:%d\n%s\n");
    LinePrinter::PrintOnNewLine(&printer,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    this->failed_ = true;
  }
  return condition;
}

Assistant:

bool testing::Test::Check(bool condition, const char* file, int line,
                          const char* error) {
  if (!condition) {
    printer.PrintOnNewLine(
        StringPrintf("*** Failure in %s:%d\n%s\n", file, line, error));
    failed_ = true;
  }
  return condition;
}